

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O3

bool __thiscall
gl3cts::TextureSizePromotion::FunctionalTest::checkSourceTextureSizeAndType
          (FunctionalTest *this,TextureInternalFormatDescriptor descriptor,GLenum target)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  GLenum GVar7;
  int iVar8;
  deUint32 dVar9;
  undefined4 extraout_var;
  size_t sVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  GLint alpha_type;
  GLint alpha_size;
  GLint green_size;
  GLenum local_2a4;
  GLenum local_2a0;
  GLenum local_29c;
  GLenum local_298;
  int local_294;
  int local_290;
  GLenum local_28c;
  int local_288;
  int local_284;
  GLenum local_280;
  GLenum local_27c;
  GLenum local_278;
  GLenum local_274;
  GLint local_270;
  GLint local_26c;
  GLint local_268;
  GLint local_264;
  int local_260;
  int local_25c;
  FunctionalTest *local_258;
  Enum<int,_2UL> local_250;
  Enum<int,_2UL> local_240;
  Enum<int,_2UL> local_230;
  Enum<int,_2UL> local_220;
  Enum<int,_2UL> local_210;
  Enum<int,_2UL> local_200;
  Enum<int,_2UL> local_1f0;
  Enum<int,_2UL> local_1e0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  long lVar10;
  
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar8);
  local_284 = 0;
  local_288 = 0;
  local_25c = 0;
  local_260 = 0;
  local_290 = 0;
  local_294 = 0;
  local_298 = 0;
  local_29c = 0;
  local_2a0 = 0;
  local_2a4 = 0;
  local_28c = 0;
  local_258 = this;
  (**(code **)(lVar10 + 0xb8))(target,this->m_source_texture);
  dVar9 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar9,"glGetTexLevelParameteriv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0x1fb);
  (**(code **)(lVar10 + 0xab0))(target,0,0x805c,&local_284);
  (**(code **)(lVar10 + 0xab0))(target,0,0x805d,&local_25c);
  (**(code **)(lVar10 + 0xab0))(target,0,0x805e,&local_288);
  (**(code **)(lVar10 + 0xab0))(target,0,0x805f,&local_260);
  (**(code **)(lVar10 + 0xab0))(target,0,0x884a,&local_290);
  (**(code **)(lVar10 + 0xab0))(target,0,0x88f1,&local_294);
  (**(code **)(lVar10 + 0xab0))(target,0,0x8c10,&local_298);
  (**(code **)(lVar10 + 0xab0))(target,0,0x8c11,&local_29c);
  (**(code **)(lVar10 + 0xab0))(target,0,0x8c12,&local_2a0);
  (**(code **)(lVar10 + 0xab0))(target,0,0x8c13,&local_2a4);
  (**(code **)(lVar10 + 0xab0))(target,0,0x8c16,&local_28c);
  dVar9 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar9,"glGetTexLevelParameteriv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0x20b);
  bVar1 = descriptor.min_red_size <= local_284;
  bVar2 = descriptor.min_green_size <= local_25c;
  local_264 = descriptor.min_blue_size;
  bVar3 = descriptor.min_blue_size <= local_288;
  bVar4 = descriptor.min_alpha_size <= local_260;
  bVar5 = descriptor.min_depth_size <= local_290;
  bVar6 = descriptor.min_stencil_size <= local_294;
  bVar12 = local_298 == descriptor.expected_red_type;
  bVar13 = local_29c == descriptor.expected_green_type;
  bVar14 = local_2a0 == descriptor.expected_blue_type;
  bVar15 = local_2a4 == descriptor.expected_alpha_type;
  bVar16 = local_28c == descriptor.expected_depth_type;
  if ((!bVar16 || (!bVar15 || (!bVar14 || !bVar13))) ||
      ((!bVar12 || (!bVar6 || !bVar5)) || ((!bVar4 || !bVar3) || (!bVar2 || !bVar1)))) {
    local_268 = descriptor.min_alpha_size;
    local_26c = descriptor.min_depth_size;
    local_270 = descriptor.min_stencil_size;
    local_278 = descriptor.expected_red_type;
    local_274 = descriptor.expected_blue_type;
    local_27c = descriptor.expected_alpha_type;
    local_280 = descriptor.expected_depth_type;
    local_1b0 = (undefined1  [8])((local_258->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Promotion from internal format ",0x1f);
    if (descriptor.internal_format_name == (GLchar *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
    }
    else {
      sVar11 = strlen(descriptor.internal_format_name);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,descriptor.internal_format_name,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," have failed during glGetTexLevelParameteriv query. ",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Expected red size = ",0x14);
    std::ostream::operator<<((ostringstream *)&local_1a8,descriptor.min_red_size);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,", expected green size = ",0x18);
    std::ostream::operator<<((ostringstream *)&local_1a8,descriptor.min_green_size);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,", expected blue size = ",0x17);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_264);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,", expected alpha size = ",0x18);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_268);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,", expected depth size = ",0x18);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_26c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,", expected stencil size = ",0x1a);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_270);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,". Queried red size = ",0x15);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_284);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,", queried green size = ",0x17);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_25c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,", queried blue size = ",0x16);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_288);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,", queried alpha size = ",0x17);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_260);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,", queried depth size = ",0x17);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_290);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,", queried stencil size = ",0x19);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_294);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,". ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Expected red type = ",0x14);
    local_1c0.m_getName = glu::getTypeName;
    local_1c0.m_value = local_278;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)&local_1a8);
    GVar7 = local_274;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,", expected green type = ",0x18);
    local_1d0.m_getName = glu::getTypeName;
    local_1d0.m_value = descriptor.expected_green_type;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,", expected blue type = ",0x17);
    local_1e0.m_getName = glu::getTypeName;
    local_1e0.m_value = GVar7;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1e0,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,", expected alpha type = ",0x18);
    local_1f0.m_getName = glu::getTypeName;
    local_1f0.m_value = local_27c;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1f0,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,", expected depth type = ",0x18);
    local_200.m_getName = glu::getTypeName;
    local_200.m_value = local_280;
    tcu::Format::Enum<int,_2UL>::toStream(&local_200,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,". Queried red type = ",0x15);
    local_210.m_getName = glu::getTypeName;
    local_210.m_value = local_298;
    tcu::Format::Enum<int,_2UL>::toStream(&local_210,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,", queried green type = ",0x17);
    local_220.m_getName = glu::getTypeName;
    local_220.m_value = local_29c;
    tcu::Format::Enum<int,_2UL>::toStream(&local_220,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,", queried blue type = ",0x16);
    local_230.m_getName = glu::getTypeName;
    local_230.m_value = local_2a0;
    tcu::Format::Enum<int,_2UL>::toStream(&local_230,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,", queried alpha type = ",0x17);
    local_240.m_getName = glu::getTypeName;
    local_240.m_value = local_2a4;
    tcu::Format::Enum<int,_2UL>::toStream(&local_240,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,", queried depth type = ",0x17);
    local_250.m_getName = glu::getTypeName;
    local_250.m_value = local_28c;
    tcu::Format::Enum<int,_2UL>::toStream(&local_250,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return (bVar16 && (bVar15 && (bVar14 && bVar13))) &&
         ((bVar12 && (bVar6 && bVar5)) && ((bVar4 && bVar3) && (bVar2 && bVar1)));
}

Assistant:

bool FunctionalTest::checkSourceTextureSizeAndType(TextureInternalFormatDescriptor descriptor, glw::GLenum target)
{
	/* GL functions object. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* query result storage */
	glw::GLint red_size		= 0;
	glw::GLint blue_size	= 0;
	glw::GLint green_size   = 0;
	glw::GLint alpha_size   = 0;
	glw::GLint depth_size   = 0;
	glw::GLint stencil_size = 0;

	glw::GLint red_type   = 0;
	glw::GLint green_type = 0;
	glw::GLint blue_type  = 0;
	glw::GLint alpha_type = 0;
	glw::GLint depth_type = 0;

	/* Bind texture */
	gl.bindTexture(target, m_source_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");

	/* queries */
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_RED_SIZE, &red_size);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_GREEN_SIZE, &green_size);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_BLUE_SIZE, &blue_size);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_ALPHA_SIZE, &alpha_size);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_DEPTH_SIZE, &depth_size);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_STENCIL_SIZE, &stencil_size);

	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_RED_TYPE, &red_type);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_GREEN_TYPE, &green_type);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_BLUE_TYPE, &blue_type);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_ALPHA_TYPE, &alpha_type);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_DEPTH_TYPE, &depth_type);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");

	/* check expected values */
	bool is_ok = true;

	is_ok = is_ok && (red_size >= descriptor.min_red_size);
	is_ok = is_ok && (green_size >= descriptor.min_green_size);
	is_ok = is_ok && (blue_size >= descriptor.min_blue_size);
	is_ok = is_ok && (alpha_size >= descriptor.min_alpha_size);
	is_ok = is_ok && (depth_size >= descriptor.min_depth_size);
	is_ok = is_ok && (stencil_size >= descriptor.min_stencil_size);

	is_ok = is_ok && ((glw::GLenum)red_type == descriptor.expected_red_type);
	is_ok = is_ok && ((glw::GLenum)green_type == descriptor.expected_green_type);
	is_ok = is_ok && ((glw::GLenum)blue_type == descriptor.expected_blue_type);
	is_ok = is_ok && ((glw::GLenum)alpha_type == descriptor.expected_alpha_type);
	is_ok = is_ok && ((glw::GLenum)depth_type == descriptor.expected_depth_type);

	/* Log on failure. */
	if (!is_ok)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Promotion from internal format " << descriptor.internal_format_name
			<< " have failed during glGetTexLevelParameteriv query. "
			<< "Expected red size = " << descriptor.min_red_size
			<< ", expected green size = " << descriptor.min_green_size
			<< ", expected blue size = " << descriptor.min_blue_size
			<< ", expected alpha size = " << descriptor.min_alpha_size
			<< ", expected depth size = " << descriptor.min_depth_size
			<< ", expected stencil size = " << descriptor.min_stencil_size << ". Queried red size = " << red_size
			<< ", queried green size = " << green_size << ", queried blue size = " << blue_size
			<< ", queried alpha size = " << alpha_size << ", queried depth size = " << depth_size
			<< ", queried stencil size = " << stencil_size << ". "
			<< "Expected red type = " << glu::getTypeStr(descriptor.expected_red_type)
			<< ", expected green type = " << glu::getTypeStr(descriptor.expected_green_type)
			<< ", expected blue type = " << glu::getTypeStr(descriptor.expected_blue_type)
			<< ", expected alpha type = " << glu::getTypeStr(descriptor.expected_alpha_type)
			<< ", expected depth type = " << glu::getTypeStr(descriptor.expected_depth_type)
			<< ". Queried red type = " << glu::getTypeStr(red_type)
			<< ", queried green type = " << glu::getTypeStr(green_type)
			<< ", queried blue type = " << glu::getTypeStr(blue_type)
			<< ", queried alpha type = " << glu::getTypeStr(alpha_type)
			<< ", queried depth type = " << glu::getTypeStr(depth_type) << "." << tcu::TestLog::EndMessage;
	}

	/* return results. */
	return is_ok;
}